

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_usage.c
# Opt level: O1

HT_MemoryUsageContext * ht_memory_usage_context_create(void *process_id)

{
  __pid_t _Var1;
  HT_MemoryUsageContext *pHVar2;
  
  pHVar2 = (HT_MemoryUsageContext *)ht_alloc(4);
  if (pHVar2 == (HT_MemoryUsageContext *)0x0) {
    pHVar2 = (HT_MemoryUsageContext *)0x0;
  }
  else {
    if (process_id == (void *)0x0) {
      _Var1 = getpid();
    }
    else {
      _Var1 = *process_id;
    }
    pHVar2->pid = _Var1;
  }
  return pHVar2;
}

Assistant:

HT_MemoryUsageContext*
ht_memory_usage_context_create(void* process_id)
{
    HT_MemoryUsageContext* context = HT_CREATE_TYPE(HT_MemoryUsageContext);

    if (context == NULL)
    {
        return NULL;
    }

    context->pid = process_id == NULL ? getpid() : *(int*)process_id;
    return context;
}